

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastGtR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  TcParseTableBase *pTVar4;
  bool bVar5;
  uint uVar6;
  MessageLite *msg_00;
  ulong uVar7;
  Nonnull<const_char_*> failure_msg;
  char *pcVar8;
  uint *puVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 offset;
  int iVar10;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  ParseContext *ctx_00;
  TcParseTableBase *table_00;
  int iVar11;
  undefined1 auVar12 [16];
  LogMessageFatal local_70;
  MessageLite *local_60;
  uint64_t local_58;
  TcParseTableBase *local_50;
  TcParseTableBase *local_48;
  TcParseTableBase *local_40;
  TcParseTableBase *local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar8 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar8;
  }
  bVar3 = *ptr;
  pTVar4 = *(TcParseTableBase **)
            ((long)&table->has_bits_offset +
            ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  offset = data.field_0 >> 0x30;
  local_60 = msg;
  local_58 = hasbits;
  local_50 = table;
  local_40 = (TcParseTableBase *)
             RefAt<google::protobuf::internal::RepeatedPtrFieldBase>(msg,offset.data);
  local_48 = pTVar4 + 1;
  local_38 = pTVar4;
  do {
    table_00 = local_40;
    msg_00 = AddMessage(local_38,(RepeatedPtrFieldBase *)local_40);
    pTVar4 = local_48;
    iVar11 = ctx->depth_;
    iVar10 = iVar11 + -1;
    ctx->depth_ = iVar10;
    ctx_00 = extraout_RDX;
    if (iVar11 < 1) goto LAB_0026d5bf;
    local_70.super_LogMessage._0_8_ = (long)&((TcParseTableBase *)ptr)->has_bits_offset + 1;
    iVar11 = ctx->group_depth_ + 1;
    ctx->group_depth_ = iVar11;
    while( true ) {
      bVar5 = ParseContext::Done(ctx,(char **)&local_70);
      if (bVar5) break;
      uVar6 = (uint)pTVar4[-1].fast_idx_mask & (uint)*(uint16_t *)local_70.super_LogMessage._0_8_;
      if ((uVar6 & 7) != 0) goto LAB_0026d66b;
      uVar7 = (ulong)(uVar6 & 0xfffffff8);
      local_70.super_LogMessage._0_8_ =
           (**(code **)(&pTVar4->has_bits_offset + uVar7))
                     (msg_00,local_70.super_LogMessage._0_8_,ctx,
                      (ulong)*(uint16_t *)local_70.super_LogMessage._0_8_ ^
                      *(ulong *)(&pTVar4->fast_idx_mask + uVar7 * 2),pTVar4 + -1,0);
      if (((TcParseTableBase *)local_70.super_LogMessage._0_8_ == (TcParseTableBase *)0x0) ||
         ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
    }
    if ((pTVar4[-1].field_0x9 & 1) == 0) {
      ptr = (char *)local_70.super_LogMessage._0_8_;
      if ((TcParseTableBase *)local_70.super_LogMessage._0_8_ == (TcParseTableBase *)0x0) {
        table_00 = pTVar4 + -1;
        VerifyHasBitConsistency(msg_00,table_00);
        auVar12._8_8_ = extraout_RDX_01;
        auVar12._0_8_ = local_70.super_LogMessage._0_8_;
        goto LAB_0026d5af;
      }
LAB_0026d50b:
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar10,ctx->depth_,"old_depth == depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        iVar10 = 0x491;
LAB_0026d6ad:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,iVar10,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_70);
      }
      table_00 = (TcParseTableBase *)(ulong)(uint)ctx->group_depth_;
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar11,ctx->group_depth_,"old_group_depth == group_depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        iVar10 = 0x492;
        goto LAB_0026d6ad;
      }
      bVar5 = false;
      ctx_00 = extraout_RDX_00;
    }
    else {
      table_00 = (TcParseTableBase *)local_70.super_LogMessage._0_8_;
      auVar12 = (undefined1  [16])
                (*pTVar4[-1].post_loop_handler)(msg_00,(char *)local_70.super_LogMessage._0_8_,ctx);
LAB_0026d5af:
      ctx_00 = auVar12._8_8_;
      ptr = auVar12._0_8_;
      if ((TcParseTableBase *)ptr != (TcParseTableBase *)0x0) goto LAB_0026d50b;
      bVar5 = true;
      ptr = (char *)0x0;
    }
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    uVar6 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    offset.data._4_4_ = 0;
    offset.data._0_4_ = uVar6;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    if ((bVar5) || (uVar6 != bVar3)) {
LAB_0026d5bf:
      pcVar8 = Error(local_60,(char *)table_00,ctx_00,(TcFieldData)offset,local_50,local_58);
      return pcVar8;
    }
    if ((TcParseTableBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)local_50->has_bits_offset != 0) {
        puVar9 = RefAt<unsigned_int>(local_60,(ulong)local_50->has_bits_offset);
        *puVar9 = *puVar9 | (uint)local_58;
      }
      return (char *)(TcParseTableBase *)ptr;
    }
    if ((byte)((TcParseTableBase *)ptr)->has_bits_offset != bVar3) {
      uVar6 = (uint)local_50->fast_idx_mask & (uint)((TcParseTableBase *)ptr)->has_bits_offset;
      if ((uVar6 & 7) == 0) {
        uVar7 = (ulong)(uVar6 & 0xfffffff8);
        pcVar8 = (char *)(**(code **)(&local_50[1].has_bits_offset + uVar7))
                                   (local_60,ptr,ctx,
                                    (ulong)((TcParseTableBase *)ptr)->has_bits_offset ^
                                    *(ulong *)(&local_50[1].fast_idx_mask + uVar7 * 2),local_50,
                                    local_58);
        return pcVar8;
      }
LAB_0026d66b:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint8_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}